

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O1

iterator * __thiscall
HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(iterator *this)

{
  double **ppdVar1;
  iterator __position;
  pointer piVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = this->currentNode;
  iVar3 = this->nodeRight[iVar4];
  if (this->nodeLeft[iVar4] == -1) {
    if (iVar3 == -1) {
      piVar2 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this->currentNode = piVar2[-1];
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar2 + -1;
      goto LAB_00326c83;
    }
  }
  else {
    if (iVar3 != -1) {
      __position._M_current =
           (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->stack,__position,
                   this->nodeRight + iVar4);
      }
      else {
        *__position._M_current = iVar3;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    iVar3 = this->nodeLeft[this->currentNode];
  }
  this->currentNode = iVar3;
LAB_00326c83:
  iVar4 = this->currentNode - iVar4;
  (this->pos_).index_ = (this->pos_).index_ + iVar4;
  ppdVar1 = &(this->pos_).value_;
  *ppdVar1 = *ppdVar1 + iVar4;
  return this;
}

Assistant:

iterator& operator++() {
      HighsInt offset = -currentNode;
      if (nodeLeft[currentNode] != -1) {
        if (nodeRight[currentNode] != -1)
          stack.push_back(nodeRight[currentNode]);
        currentNode = nodeLeft[currentNode];
      } else if (nodeRight[currentNode] != -1) {
        currentNode = nodeRight[currentNode];
      } else {
        currentNode = stack.back();
        stack.pop_back();
      }
      offset += currentNode;
      pos_.index_ += offset;
      pos_.value_ += offset;
      return *this;
    }